

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O2

void __thiscall key_tests::key_ellswift::test_method(key_ellswift *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  Span<const_std::byte> ent32_00;
  RandomMixin<FastRandomContext> *this_00;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  lazy_ostream local_240;
  undefined1 *local_230;
  char **local_228;
  assertion_result local_220;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  CKey key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  shared_count asStack_198 [7];
  CPubKey decoded_pubkey;
  EllSwiftPubKey ellswift;
  uint256 ent32;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(local_b8,&strSecret1_abi_cxx11_);
  std::__cxx11::string::string(local_98,&strSecret2_abi_cxx11_);
  std::__cxx11::string::string(local_78,&strSecret1C_abi_cxx11_);
  std::__cxx11::string::string(local_58,&strSecret2C_abi_cxx11_);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.super_RandomMixin<FastRandomContext>;
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
    DecodeSecret((string *)&key);
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x155;
    file.m_begin = (iterator)&local_1c8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d8,msg);
    local_1a8._M_local_buf[0] =
         (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )key.keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
    local_1a8._8_8_ = 0;
    asStack_198[0].pi_ = (sp_counted_base *)0x0;
    ellswift.m_pubkey._M_elems._0_8_ = (long)"!key.IsValid()" + 1;
    ellswift.m_pubkey._M_elems._8_8_ = (long)"!key.IsValid()" + 0xe;
    decoded_pubkey.vch[8] = '\0';
    decoded_pubkey.vch._0_8_ = &PTR__lazy_ostream_011481f0;
    decoded_pubkey.vch._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
    local_1e0 = "";
    pvVar2 = &DAT_00000001;
    pvVar3 = (iterator)0x0;
    decoded_pubkey.vch._24_8_ = &ellswift;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1a8,(lazy_ostream *)&decoded_pubkey,1,0,WARN,
               (check_type)this_00,(size_t)&local_1e8,0x155);
    boost::detail::shared_count::~shared_count(asStack_198);
    RandomMixin<FastRandomContext>::rand256(&ent32,this_00);
    ent32_00.m_size = 0x20;
    ent32_00.m_data = (byte *)&ent32;
    CKey::EllSwiftCreate(&ellswift,&key,ent32_00);
    EllSwiftPubKey::Decode(&decoded_pubkey,&ellswift);
    if (key.fCompressed == false) {
      CPubKey::Decompress(&decoded_pubkey);
    }
    local_1f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x161;
    file_00.m_begin = (iterator)&local_1f8;
    msg_00.m_end = pvVar3;
    msg_00.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208,
               msg_00);
    CKey::GetPubKey((CPubKey *)&local_1a8,&key);
    local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)::operator==((CPubKey *)&local_1a8,&decoded_pubkey);
    local_220.m_message.px = (element_type *)0x0;
    local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_250 = "key.GetPubKey() == decoded_pubkey";
    local_248 = "";
    local_240.m_empty = false;
    local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_230 = boost::unit_test::lazy_ostream::inst;
    local_228 = &local_250;
    local_260 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
    local_258 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_220,&local_240,1,0,WARN,(check_type)this_00,(size_t)&local_260,0x161);
    boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&key.keydata);
  }
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string(local_b8 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(key_ellswift)
{
    for (const auto& secret : {strSecret1, strSecret2, strSecret1C, strSecret2C}) {
        CKey key = DecodeSecret(secret);
        BOOST_CHECK(key.IsValid());

        uint256 ent32 = m_rng.rand256();
        auto ellswift = key.EllSwiftCreate(AsBytes(Span{ent32}));

        CPubKey decoded_pubkey = ellswift.Decode();
        if (!key.IsCompressed()) {
            // The decoding constructor returns a compressed pubkey. If the
            // original was uncompressed, we must decompress the decoded one
            // to compare.
            decoded_pubkey.Decompress();
        }
        BOOST_CHECK(key.GetPubKey() == decoded_pubkey);
    }
}